

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  long *plVar1;
  long *plVar2;
  int in_EDX;
  int value;
  char *pcVar3;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  value = 0x161060;
  switch((String *)(ulong)(uint)c) {
  case (String *)0x0:
    pcVar3 = "\\0";
    break;
  case (String *)0x1:
  case (String *)0x2:
  case (String *)0x3:
  case (String *)0x4:
  case (String *)0x5:
  case (String *)0x6:
switchD_0015477a_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      local_50 = (long *)CONCAT71(local_50._1_7_,(char)c);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
      return kAsIs;
    }
    String::FormatHexInt_abi_cxx11_(&local_30,(String *)(ulong)(uint)c,value);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x163dc1);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_40 = *plVar2;
      lStack_38 = plVar1[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar2;
      local_50 = (long *)*plVar1;
    }
    local_48 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    return kHexEscape;
  case (String *)0x7:
    pcVar3 = "\\a";
    break;
  case (String *)0x8:
    pcVar3 = "\\b";
    break;
  case (String *)0x9:
    pcVar3 = "\\t";
    break;
  case (String *)0xa:
    pcVar3 = "\\n";
    break;
  case (String *)0xb:
    pcVar3 = "\\v";
    break;
  case (String *)0xc:
    pcVar3 = "\\f";
    break;
  case (String *)0xd:
    pcVar3 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar3 = "\\\'";
    }
    else {
      value = in_EDX;
      if (c != L'\\') goto switchD_0015477a_caseD_1;
      pcVar3 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,2);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}